

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

ostream * serialize::write<int,float>
                    (ostream *ostream_,
                    map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                    *container)

{
  _Base_ptr p_Var1;
  uint local_3c;
  undefined8 uStack_38;
  uint32_t size;
  pair<const_int,_float> p;
  
  local_3c = (uint)(container->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  write<unsigned_int>(ostream_,&local_3c);
  for (p_Var1 = (container->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(container->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    uStack_38 = *(undefined8 *)(p_Var1 + 1);
    write<int_const>(ostream_,(int *)&stack0xffffffffffffffc8);
    write<float>(ostream_,(float *)&size);
  }
  return ostream_;
}

Assistant:

static inline ostream&  write(ostream& ostream_, map<K, V>& container)
{

	uint32_t size = container.size();
	write(ostream_, size);

	for (auto p : container)
	{
		write(ostream_, p.first);
		write(ostream_, p.second);


	}
	return ostream_;
}